

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<Fad<float>_>::Subtract
          (TPZMatrix<Fad<float>_> *this,TPZMatrix<Fad<float>_> *A,TPZMatrix<Fad<float>_> *res)

{
  uint uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  long lVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  float *pfVar7;
  float *pfVar8;
  ulong uVar9;
  float *pfVar10;
  float *pfVar11;
  long lVar12;
  TPZFMatrix<Fad<float>_> ref;
  Fad<float> local_178;
  undefined1 local_158 [152];
  undefined1 local_c0 [144];
  
  if (((this->super_TPZBaseMatrix).fRow != (A->super_TPZBaseMatrix).fRow) ||
     ((this->super_TPZBaseMatrix).fCol != (A->super_TPZBaseMatrix).fCol)) {
    Error("Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>",(char *)0x0);
  }
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(this);
  iVar4 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])();
  if (CONCAT44(extraout_var,iVar3) == CONCAT44(extraout_var_00,iVar4)) {
    (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1f])(res,this);
    lVar5 = __dynamic_cast(res,&TPZMatrix<Fad<float>>::typeinfo,&TPZFMatrix<Fad<float>>::typeinfo,0)
    ;
    if (lVar5 != 0) {
      lVar5 = __dynamic_cast(A,&TPZMatrix<Fad<float>>::typeinfo,&TPZFMatrix<Fad<float>>::typeinfo,0)
      ;
      lVar6 = __dynamic_cast(this,&TPZMatrix<Fad<float>>::typeinfo,&TPZFMatrix<Fad<float>>::typeinfo
                             ,0);
      if ((lVar6 == 0) || (lVar5 == 0)) {
        lVar5 = (this->super_TPZBaseMatrix).fRow;
        if (lVar5 < 1) {
          return;
        }
        lVar6 = (this->super_TPZBaseMatrix).fCol;
        lVar12 = 0;
        do {
          if (0 < lVar6) {
            lVar5 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (local_c0,this,lVar12,lVar5);
              (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_178,A,lVar12,lVar5);
              uVar2 = local_c0._8_4_;
              iVar3 = local_178.dx_.num_elts;
              local_158._0_4_ = (float)local_c0._0_4_ - local_178.val_;
              uVar1 = local_178.dx_.num_elts;
              if (local_178.dx_.num_elts < (int)local_c0._8_4_) {
                uVar1 = local_c0._8_4_;
              }
              local_158._8_4_ = 0;
              local_158._16_8_ = (float *)0x0;
              if (0 < (int)uVar1) {
                local_158._8_4_ = uVar1;
                local_158._16_8_ = operator_new__((ulong)uVar1 * 4);
                local_158._24_4_ = 0.0;
                uVar9 = 0;
                pfVar7 = (float *)local_c0._16_8_;
                pfVar8 = local_178.dx_.ptr_to_data;
                do {
                  pfVar10 = pfVar7;
                  if (uVar2 == 0) {
                    pfVar10 = (float *)(local_c0 + 0x18);
                  }
                  pfVar11 = pfVar8;
                  if (iVar3 == 0) {
                    pfVar11 = &local_178.defaultVal;
                  }
                  *(float *)(local_158._16_8_ + uVar9 * 4) = *pfVar10 - *pfVar11;
                  uVar9 = uVar9 + 1;
                  pfVar8 = pfVar8 + 1;
                  pfVar7 = pfVar7 + 1;
                } while (uVar1 != uVar9);
              }
              local_158._24_4_ = 0.0;
              (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                        (res,lVar12,lVar5,(Fad<float> *)local_158);
              Fad<float>::~Fad((Fad<float> *)local_158);
              Fad<float>::~Fad(&local_178);
              Fad<float>::~Fad((Fad<float> *)local_c0);
              lVar5 = lVar5 + 1;
              lVar6 = (this->super_TPZBaseMatrix).fCol;
            } while (lVar5 < lVar6);
            lVar5 = (this->super_TPZBaseMatrix).fRow;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < lVar5);
        return;
      }
    }
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4a])(this,res,A);
    iVar3 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(A);
    iVar4 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4d])(A);
    TPZFMatrix<Fad<float>_>::TPZFMatrix
              ((TPZFMatrix<Fad<float>_> *)local_c0,CONCAT44(extraout_var_01,iVar3),1,
               (Fad<float> *)CONCAT44(extraout_var_02,iVar4),CONCAT44(extraout_var_01,iVar3));
    Storage((TPZFMatrixRef<Fad<float>_> *)local_158,res);
    TPZFMatrix<Fad<float>_>::operator-=
              ((TPZFMatrix<Fad<float>_> *)local_158,(TPZMatrix<Fad<float>_> *)local_c0);
    TPZFMatrixRef<Fad<float>_>::~TPZFMatrixRef
              ((TPZFMatrixRef<Fad<float>_> *)local_158,&TPZFMatrixRef<Fad<float>>::VTT);
    TPZFMatrix<Fad<float>_>::~TPZFMatrix((TPZFMatrix<Fad<float>_> *)local_c0);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "void TPZMatrix<Fad<float>>::Subtract(const TPZMatrix<TVar> &, TPZMatrix<TVar> &) const [T = Fad<float>]"
             ,0x67);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ERROR\nDifferent number of entries.\nAborting...\n",0x2f);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp",
             0x698);
}

Assistant:

void TPZMatrix<TVar>::Subtract(const TPZMatrix<TVar> &A,TPZMatrix<TVar> &res) const {
	
	if ((Rows() != A.Rows()) || (Cols() != A.Cols()) ) {
		Error( "Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>" );
	}
	if(this->Size()!=A.Size()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"ERROR\nDifferent number of entries.\nAborting...\n";
    DebugStop();
  }
  res.CopyFrom(this);
  auto thisFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(this);
  auto aFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(&A);
  auto resFmat =
    dynamic_cast<TPZFMatrix<TVar>*>(&res);
  if(resFmat && (!thisFmat || !aFmat)){
    for ( int64_t r = 0; r < Rows(); r++ )
      for ( int64_t c = 0; c < Cols(); c++ )
        res.PutVal( r, c, GetVal(r,c)-A.GetVal(r,c) );
  }else{
    CheckTypeCompatibility(&res,&A);
    res.Storage() -= A.Storage();
  }
}